

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

void byte_swap(char *data,int size)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = size + -1;
  for (uVar2 = 0; (uint)size >> 1 != uVar2; uVar2 = uVar2 + 1) {
    cVar1 = data[uVar2];
    data[uVar2] = data[iVar3];
    data[iVar3] = cVar1;
    iVar3 = iVar3 + -1;
  }
  return;
}

Assistant:

static void
byte_swap(char *data, int size)
{
    int i;
    assert((size % 2) == 0);
    for (i = 0; i < size / 2; i++) {
	char tmp = data[i];
	data[i] = data[size - i - 1];
	data[size - i - 1] = tmp;
    }
}